

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O3

void __thiscall
wasm::ReconstructStringifyWalker::transitionToInSkipSeq(ReconstructStringifyWalker *this)

{
  pointer pOVar1;
  Function *pFVar2;
  Name name;
  Fatal local_1d0;
  undefined1 local_48 [8];
  Result<wasm::Ok> _val;
  
  pOVar1 = (this->sequences).
           super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>.
           _M_impl.super__Vector_impl_data._M_start;
  name.super_IString.str._M_str =
       *(char **)((long)&pOVar1[this->seqCounter].func.super_IString.str + 8);
  name.super_IString.str._M_len = pOVar1[this->seqCounter].func.super_IString.str._M_len;
  pFVar2 = Module::getFunction((this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
                               super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                               .
                               super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                               .currModule,name);
  IRBuilder::makeCall((Result<wasm::Ok> *)local_48,&this->existingBuilder,
                      (Name)(pFVar2->super_Importable).super_Named.name.super_IString.str,false);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    Fatal::Fatal(&local_1d0);
    Fatal::operator<<(&local_1d0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)
    ;
LAB_008ae0d4:
    Fatal::~Fatal(&local_1d0);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
  if ((this->sequences).
      super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
      super__Vector_impl_data._M_start[this->seqCounter].endsTypeUnreachable == true) {
    IRBuilder::makeUnreachable((Result<wasm::Ok> *)local_48,&this->existingBuilder);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      Fatal::Fatal(&local_1d0);
      Fatal::operator<<(&local_1d0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
      goto LAB_008ae0d4;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
  }
  return;
}

Assistant:

void transitionToInSkipSeq() {
    Function* outlinedFunc =
      getModule()->getFunction(sequences[seqCounter].func);
    ODBG(std::cerr << "\nstarting to skip instructions "
                   << sequences[seqCounter].startIdx << " - "
                   << sequences[seqCounter].endIdx - 1 << " to "
                   << sequences[seqCounter].func
                   << " and adding call() instead\n");
    ASSERT_OK(existingBuilder.makeCall(outlinedFunc->name, false));
    // If the last instruction of the outlined sequence is unreachable, insert
    // an unreachable instruction immediately after the call to the outlined
    // function. This maintains the unreachable type in the original scope
    // of the outlined sequence.
    if (sequences[seqCounter].endsTypeUnreachable) {
      ASSERT_OK(existingBuilder.makeUnreachable());
    }
  }